

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

int bucket_insert(bucket b,void *key,void *value)

{
  int iVar1;
  undefined8 *puVar2;
  size_t in_RDX;
  bucket in_RSI;
  long *in_RDI;
  pair p;
  bucket in_stack_ffffffffffffffd8;
  int local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RSI == (bucket)0x0)) || (in_RDX == 0)) {
    log_write_impl_va("metacall",0xf2,"bucket_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,"Invalid bucket insert parameters");
    local_4 = 1;
  }
  else if ((in_RDI[2] == 0) &&
          (iVar1 = bucket_alloc_pairs(in_stack_ffffffffffffffd8,0x11cb41), iVar1 != 0)) {
    log_write_impl_va("metacall",0xf8,"bucket_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,"Invalid bucket insertion pairs allocation");
    local_4 = 1;
  }
  else if ((*in_RDI + 1U < (ulong)in_RDI[1]) ||
          (iVar1 = bucket_realloc_pairs(in_RSI,in_RDX), iVar1 == 0)) {
    puVar2 = (undefined8 *)(in_RDI[2] + *in_RDI * 0x10);
    *puVar2 = in_RSI;
    puVar2[1] = in_RDX;
    *in_RDI = *in_RDI + 1;
    local_4 = 0;
  }
  else {
    log_write_impl_va("metacall",0x100,"bucket_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,"Invalid bucket insertion pairs reallocation");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int bucket_insert(bucket b, void *key, void *value)
{
	pair p;

	if (b == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insert parameters");
		return 1;
	}

	if (b->pairs == NULL && bucket_alloc_pairs(b, BUCKET_PAIRS_DEFAULT) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs allocation");
		return 1;
	}

	if ((b->count + 1) >= b->capacity)
	{
		if (bucket_realloc_pairs(b, b->capacity << 1) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs reallocation");
			return 1;
		}
	}

	p = &b->pairs[b->count];

	p->key = key;
	p->value = value;

	++b->count;

	return 0;
}